

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::BufferTest::LoopTestOverS<short,false>
          (BufferTest *this,bool use_range_version,bool skip_rgb)

{
  bool bVar1;
  bool bVar2;
  GLchar *variable_declaration;
  undefined1 local_13;
  bool result;
  bool skip_rgb_local;
  bool use_range_version_local;
  BufferTest *this_local;
  
  variable_declaration = FragmentShaderDeclaration<short,false>();
  PrepareProgram(this,variable_declaration);
  local_13 = Test<short,4,false>(this,use_range_version);
  if (!skip_rgb) {
    bVar1 = Test<short,3,false>(this,use_range_version);
    local_13 = local_13 && bVar1;
  }
  bVar1 = Test<short,2,false>(this,use_range_version);
  bVar2 = Test<short,1,false>(this,use_range_version);
  CleanProgram(this);
  CleanErrors(this);
  return (local_13 & bVar1) != 0 && bVar2;
}

Assistant:

bool BufferTest::LoopTestOverS(bool use_range_version, bool skip_rgb)
{
	/* Prepare one program per test loop. */
	PrepareProgram(FragmentShaderDeclaration<T, N>());

	/* Run tests. */
	bool result = Test<T, 4, N>(use_range_version);

	if (!skip_rgb)
	{
		result &= Test<T, 3, N>(use_range_version);
	}

	result &= Test<T, 2, N>(use_range_version);
	result &= Test<T, 1, N>(use_range_version);

	/* Cleanup.*/
	CleanProgram();
	CleanErrors();

	/* Pass result. */
	return result;
}